

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall LogicalOperationNode::Evaluate(LogicalOperationNode *this,Date *date,string *event)

{
  element_type *peVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->operation == Or) {
    peVar1 = (this->lhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (**peVar1->_vptr_Node)(peVar1,date,event);
    if ((char)iVar2 == '\0') {
LAB_0010d5c0:
      peVar1 = (this->rhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar2 = (**peVar1->_vptr_Node)(peVar1,date,event);
      return SUB41(iVar2,0);
    }
  }
  else if (this->operation == And) {
    peVar1 = (this->lhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (**peVar1->_vptr_Node)(peVar1,date,event);
    if ((char)iVar2 != '\0') goto LAB_0010d5c0;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool LogicalOperationNode::Evaluate(const Date &date, const string &event) const {
    switch (operation) {
        case And:
            return lhs_node->Evaluate(date,event) && rhs_node->Evaluate(date,event);
        case Or:
            return lhs_node->Evaluate(date,event) || rhs_node->Evaluate(date,event);
    }
    return true; // unreachable
}